

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O3

bool test_DiceRoller_getPercentages(void)

{
  int *piVar1;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  DiceRoller *this;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  void *pvVar9;
  ulong unaff_R12;
  vector<double,_std::allocator<double>_> local_50;
  double local_38;
  
  plVar3 = (long *)operator_new(0x18);
  *plVar3 = 0;
  plVar3[1] = 0;
  plVar3[2] = 0;
  puVar4 = (undefined8 *)operator_new(0x18);
  *plVar3 = (long)puVar4;
  plVar3[2] = (long)(puVar4 + 3);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  plVar3[1] = (long)(puVar4 + 3);
  this = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this);
  iVar8 = 100;
  do {
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)&local_50,this,1);
    if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      goto LAB_0010191f;
    }
    unaff_R12 = (ulong)*(int *)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pvVar9 = (void *)*plVar3;
    piVar1 = (int *)((long)pvVar9 + unaff_R12 * 4 + -4);
    *piVar1 = *piVar1 + 1;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  lVar5 = plVar3[1];
  uVar7 = lVar5 - (long)pvVar9 >> 2;
  bVar2 = true;
  if (0 < (int)uVar7) {
    unaff_R12 = 0;
    do {
      if (uVar7 <= unaff_R12) {
LAB_0010191f:
        uVar6 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,unaff_R12);
        operator_delete(this,0x10);
        _Unwind_Resume(uVar6);
      }
      if (bVar2) {
        local_38 = (double)*(int *)((long)pvVar9 + unaff_R12 * 4) / 100.0;
        DiceRoller::getPercentages(&local_50,this);
        bVar2 = local_38 ==
                local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[unaff_R12];
        operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
        pvVar9 = (void *)*plVar3;
        lVar5 = plVar3[1];
      }
      else {
        bVar2 = false;
      }
      unaff_R12 = unaff_R12 + 1;
      uVar7 = lVar5 - (long)pvVar9 >> 2;
    } while ((long)unaff_R12 < (long)(int)((ulong)(lVar5 - (long)pvVar9) >> 2));
    if (pvVar9 == (void *)0x0) goto LAB_001018d9;
  }
  operator_delete(pvVar9,plVar3[2] - (long)pvVar9);
LAB_001018d9:
  operator_delete(plVar3,0x18);
  DiceRoller::~DiceRoller(this);
  operator_delete(this,0x10);
  return bVar2;
}

Assistant:

bool test_DiceRoller_getPercentages() {
    bool success = true;
    int timesRolled = 0;
    auto* history = new std::vector<int>(6);
    auto* roller = new DiceRoller();
    for (int x = 0; x < 100; x++) {
        int roll = roller->roll(1).at(0);
        timesRolled++;
        (*history)[roll - 1]++;
    }

    for (int x = 0; x < (int) history->size(); x++) {
        double percent = (double) history->at(x) / (double) timesRolled;
        success = success && percent == roller->getPercentages()[x];
    }

    delete (history);
    delete (roller);

    return success;
}